

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O0

void __thiscall gutil::Parameter::printHelp(Parameter *this,ostream *out,size_t columns)

{
  ulong uVar1;
  long lVar2;
  ostream *this_00;
  size_type sVar3;
  char *pcVar4;
  const_reference pvVar5;
  unsigned_long *puVar6;
  ulong in_RDX;
  ostream *in_RSI;
  long in_RDI;
  size_t n_1;
  string descr;
  string val_1;
  size_t i_1;
  size_t n;
  string val;
  size_t i;
  size_t col1;
  string local_f0 [8];
  string *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  ulong local_b0;
  string local_a8 [32];
  string local_88 [32];
  ulong local_68;
  unsigned_long local_50;
  string local_48 [32];
  ulong local_28;
  unsigned_long local_20;
  ulong local_18;
  ostream *local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    this_00 = std::operator<<(local_10,(string *)(in_RDI + 0x30));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x18));
    if (sVar3 <= uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18),local_28);
    anon_unknown_3::getValue(in_stack_ffffffffffffff18);
    local_50 = std::__cxx11::string::size();
    if (local_50 != 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
      if (*pcVar4 == '<') {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x18),local_28);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
        if (*pcVar4 == ' ') {
          local_50 = local_50 + 1;
        }
      }
    }
    puVar6 = std::max<unsigned_long>(&local_20,&local_50);
    local_20 = *puVar6;
    std::__cxx11::string::~string(local_48);
    local_28 = local_28 + 1;
  }
  local_20 = local_20 + 1;
  if (local_18 >> 1 < local_20) {
    local_20 = local_18 >> 1;
  }
  local_68 = 0;
  while( true ) {
    uVar1 = local_68;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x18));
    if (sVar3 <= uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18),local_68);
    anon_unknown_3::getValue(in_stack_ffffffffffffff18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18),local_68);
    anon_unknown_3::getDescription(in_stack_ffffffffffffff18);
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      std::__cxx11::string::string(local_f0,local_a8);
      anon_unknown_3::printDescription
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (size_t)in_stack_ffffffffffffff18);
      std::__cxx11::string::~string(local_f0);
    }
    else {
      local_b0 = 0;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      if (*pcVar4 != '-') {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(in_RDI + 0x18),local_68);
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar5);
        if (*pcVar4 == ' ') {
          std::operator<<(local_10,"  ");
          local_b0 = 2;
        }
      }
      std::operator<<(local_10,local_88);
      lVar2 = std::__cxx11::string::length();
      for (local_b0 = lVar2 + local_b0; local_b0 < local_20; local_b0 = local_b0 + 1) {
        std::operator<<(local_10,' ');
      }
      if (local_20 < local_b0) {
        std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::string((string *)&stack0xffffffffffffff30,local_a8);
      anon_unknown_3::printDescription
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 (size_t)in_stack_ffffffffffffff18);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    }
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

void Parameter::printHelp(std::ostream &out, size_t columns)
const
{
  size_t col1=0;

  if (creat.size() > 0)
  {
    out << creat << std::endl;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    size_t n=val.size();

    if (n > 0 && val[0] == '<' && def[i][0] == ' ')
    {
      n++;
    }

    col1=std::max(col1, n);
  }

  col1++;

  if (col1 > columns/2)
  {
    col1=columns/2;
  }

  for (size_t i=0; i<def.size(); i++)
  {
    std::string val=getValue(def[i]);
    std::string descr=getDescription(def[i]);

    if (val.size() > 0)
    {
      size_t n=0;

      if (val[0] != '-' && def[i][0] == ' ')
      {
        out << "  ";
        n+=2;
      }

      out << val;
      n+=val.length();

      while (n < col1)
      {
        out << ' ';
        n++;
      }

      if (n > col1)
      {
        out << std::endl;
        n=0;
      }

      printDescription(out, descr, col1, columns);
    }
    else
    {
      printDescription(out, descr, 0, columns);
    }
  }
}